

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O2

int ncnn::gru(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint _h;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  void *pvVar10;
  int i;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  float *pfVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  void *pvVar23;
  ulong uVar24;
  void *pvVar25;
  void *pvVar26;
  ulong uVar27;
  long lVar28;
  void *pvVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  int local_160;
  Mat gates;
  
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  _h = top_blob->w;
  Mat::Mat(&gates,2,_h,4,opt->workspace_allocator);
  local_160 = -100;
  if ((gates.data != (void *)0x0) && ((long)gates.c * gates.cstep != 0)) {
    pvVar5 = bottom_blob->data;
    iVar3 = bottom_blob->w;
    sVar6 = bottom_blob->elemsize;
    pvVar7 = top_blob->data;
    iVar4 = top_blob->w;
    sVar8 = top_blob->elemsize;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    local_160 = 0;
    uVar24 = (ulong)_h;
    if ((int)_h < 1) {
      uVar24 = 0;
    }
    uVar16 = 0;
    if (0 < (int)uVar2) {
      uVar16 = uVar2;
    }
    for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
      uVar11 = ~uVar17 + uVar2;
      if (reverse == 0) {
        uVar11 = uVar17;
      }
      lVar20 = (long)iVar3 * sVar6 * (long)(int)uVar11;
      lVar12 = (long)gates.w * gates.elemsize;
      pvVar9 = bias_c->data;
      lVar13 = (long)bias_c->w * bias_c->elemsize;
      pvVar25 = weight_xc->data;
      pvVar26 = weight_hc->data;
      lVar21 = (long)weight_xc->w * weight_xc->elemsize;
      pvVar18 = (void *)(lVar21 * (int)_h + (long)pvVar25);
      lVar28 = (long)weight_hc->w * weight_hc->elemsize;
      pvVar23 = (void *)(lVar28 * (int)_h + (long)pvVar26);
      pvVar29 = (void *)(lVar28 * (int)(_h * 2) + (long)pvVar26);
      pvVar22 = (void *)(lVar21 * (int)(_h * 2) + (long)pvVar25);
      for (uVar27 = 0; uVar27 != uVar24; uVar27 = uVar27 + 1) {
        lVar14 = lVar12 * uVar27;
        fVar32 = *(float *)((long)pvVar9 + uVar27 * 4);
        fVar31 = *(float *)((long)pvVar9 + uVar27 * 4 + lVar13);
        for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
          fVar30 = *(float *)((long)pvVar5 + uVar15 * 4 + lVar20);
          fVar31 = fVar31 + fVar30 * *(float *)((long)pvVar18 + uVar15 * 4);
          fVar32 = fVar32 + fVar30 * *(float *)((long)pvVar25 + uVar15 * 4);
        }
        pvVar10 = hidden_state->data;
        for (uVar15 = 0; _h != uVar15; uVar15 = uVar15 + 1) {
          fVar30 = *(float *)((long)pvVar10 + uVar15 * 4);
          fVar31 = fVar31 + fVar30 * *(float *)((long)pvVar23 + uVar15 * 4);
          fVar32 = fVar32 + fVar30 * *(float *)((long)pvVar26 + uVar15 * 4);
        }
        fVar30 = expf(-fVar32);
        fVar31 = expf(-fVar31);
        fVar32 = *(float *)((long)pvVar9 + uVar27 * 4 + lVar13 * 3);
        for (uVar15 = 0; _h != uVar15; uVar15 = uVar15 + 1) {
          fVar32 = fVar32 + *(float *)((long)pvVar29 + uVar15 * 4) *
                            *(float *)((long)pvVar10 + uVar15 * 4);
        }
        fVar32 = fVar32 / (fVar30 + 1.0) + *(float *)((long)pvVar9 + uVar27 * 4 + lVar13 * 2);
        for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
          fVar32 = fVar32 + *(float *)((long)pvVar22 + uVar15 * 4) *
                            *(float *)((long)pvVar5 + uVar15 * 4 + lVar20);
        }
        fVar32 = tanhf(fVar32);
        *(float *)((long)gates.data + lVar14) = 1.0 / (fVar31 + 1.0);
        *(float *)((long)gates.data + lVar14 + 4) = fVar32;
        pvVar18 = (void *)((long)pvVar18 + lVar21);
        pvVar25 = (void *)((long)pvVar25 + lVar21);
        pvVar23 = (void *)((long)pvVar23 + lVar28);
        pvVar26 = (void *)((long)pvVar26 + lVar28);
        pvVar29 = (void *)((long)pvVar29 + lVar28);
        pvVar22 = (void *)((long)pvVar22 + lVar21);
      }
      pvVar9 = hidden_state->data;
      pfVar19 = (float *)((long)gates.data + 4);
      for (uVar27 = 0; uVar24 != uVar27; uVar27 = uVar27 + 1) {
        fVar32 = (*(float *)((long)pvVar9 + uVar27 * 4) - *pfVar19) * pfVar19[-1] + *pfVar19;
        *(float *)((long)pvVar9 + uVar27 * 4) = fVar32;
        *(float *)((long)pvVar7 + uVar27 * 4 + (long)(int)uVar11 * (long)iVar4 * sVar8) = fVar32;
        pfVar19 = (float *)((long)pfVar19 + (long)gates.w * gates.elemsize);
      }
    }
  }
  Mat::~Mat(&gates);
  return local_160;
}

Assistant:

static int gru(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const float* weight_xc_R = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_U = weight_xc.row(num_output * 1 + q);
            const float* weight_hc_R = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_U = weight_hc.row(num_output * 1 + q);

            float R = bias_c_R[q];
            float U = bias_c_U[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                R += weight_xc_R[i] * xi;
                U += weight_xc_U[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                R += weight_hc_R[i] * h_cont;
                U += weight_hc_U[i] * h_cont;
            }

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + exp(-R));
            U = 1.f / (1.f + exp(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const float* weight_xc_N = weight_xc.row(num_output * 2 + q);
            const float* weight_hc_N = weight_hc.row(num_output * 2 + q);

            float N = bias_c_BN[q];

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                N += weight_hc_N[i] * h_cont;
            }

            N = bias_c_WN[q] + R * N;

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                N += weight_xc_N[i] * xi;
            }

            // tanh(N)
            N = tanh(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}